

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joint.cpp
# Opt level: O3

void __thiscall
CMU462::DynamicScene::Joint::drag
          (Joint *this,double x,double y,double dx,double dy,Matrix4x4 *modelViewProj)

{
  undefined1 auVar1 [16];
  double dVar2;
  long lVar3;
  Matrix4x4 *pMVar4;
  Matrix4x4 *pMVar5;
  Joint *j;
  Joint *pJVar6;
  byte bVar7;
  double dVar8;
  Matrix4x4 T;
  undefined1 local_1d8 [24];
  double dStack_1c0;
  Matrix4x4 local_1b8;
  Matrix4x4 local_130;
  Matrix4x4 local_b0;
  
  bVar7 = 0;
  local_1d8._0_8_ = (this->super_SceneObject).position.x;
  local_1d8._8_8_ = (this->super_SceneObject).position.y;
  local_1d8._16_8_ = (this->super_SceneObject).position.z;
  dStack_1c0 = 1.0;
  Matrix4x4::operator*(modelViewProj,(Vector4D *)local_1d8);
  dVar8 = 1.0 / local_130.entries[0].w;
  local_1d8._0_8_ = (dVar8 * local_130.entries[0].x + dx) * local_130.entries[0].w;
  local_1d8._8_8_ = (dVar8 * local_130.entries[0].y + dy) * local_130.entries[0].w;
  dVar2 = local_130.entries[0].w * dVar8 * local_130.entries[0].w;
  unique0x100000f4 = SUB84(dVar2,0);
  local_1d8._16_8_ = local_130.entries[0].z * dVar8 * local_130.entries[0].w;
  unique0x100000f8 = (int)((ulong)dVar2 >> 0x20);
  Matrix4x4::inv(&local_130,modelViewProj);
  Matrix4x4::operator*(&local_130,(Vector4D *)local_1d8);
  local_1d8._0_8_ = local_1b8.entries[0].x;
  local_1d8._8_8_ = local_1b8.entries[0].y;
  Matrix4x4::identity();
  pJVar6 = this;
  do {
    (*(pJVar6->super_SceneObject)._vptr_SceneObject[0xc])(&local_b0,pJVar6);
    Matrix4x4::operator*(&local_1b8,&local_b0,&local_130);
    pMVar4 = &local_1b8;
    pMVar5 = &local_130;
    for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
      pMVar5->entries[0].x = pMVar4->entries[0].x;
      pMVar4 = (Matrix4x4 *)((long)pMVar4 + ((ulong)bVar7 * -2 + 1) * 8);
      pMVar5 = (Matrix4x4 *)((long)pMVar5 + ((ulong)bVar7 * -2 + 1) * 8);
    }
    pJVar6 = pJVar6->parent;
  } while (pJVar6 != (Joint *)0x0);
  (*(this->skeleton->mesh->super_SceneObject)._vptr_SceneObject[0xc])(&local_b0);
  Matrix4x4::operator*(&local_1b8,&local_b0,&local_130);
  pMVar4 = &local_1b8;
  pMVar5 = &local_130;
  for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
    pMVar5->entries[0].x = pMVar4->entries[0].x;
    pMVar4 = (Matrix4x4 *)((long)pMVar4 + ((ulong)bVar7 * -2 + 1) * 8);
    pMVar5 = (Matrix4x4 *)((long)pMVar5 + ((ulong)bVar7 * -2 + 1) * 8);
  }
  Matrix4x4::inv(&local_1b8,&local_130);
  Matrix4x4::operator*(&local_1b8,(Vector4D *)local_1d8);
  local_1d8._0_8_ = local_b0.entries[0].x;
  local_1d8._8_8_ = local_b0.entries[0].y;
  if (this->skeleton->root == this) {
    Vector4D::to3D((Vector4D *)local_1d8);
    (this->super_SceneObject).position.z = local_1b8.entries[0].z;
    (this->super_SceneObject).position.x = local_1b8.entries[0].x;
    (this->super_SceneObject).position.y = local_1b8.entries[0].y;
  }
  else {
    Vector4D::to3D((Vector4D *)local_1d8);
    local_1b8.entries[0].x = (this->axis).x + local_1b8.entries[0].x;
    local_1b8.entries[0].y = (this->axis).y + local_1b8.entries[0].y;
    auVar1._8_4_ = SUB84(local_1b8.entries[0].y,0);
    auVar1._0_8_ = local_1b8.entries[0].x;
    auVar1._12_4_ = (int)((ulong)local_1b8.entries[0].y >> 0x20);
    (this->axis).x = local_1b8.entries[0].x;
    (this->axis).y = (double)auVar1._8_8_;
    (this->axis).z = local_1b8.entries[0].z + (this->axis).z;
  }
  return;
}

Assistant:

void Joint::drag(double x, double y, double dx, double dy, const Matrix4x4& modelViewProj)
   {
      Vector4D q(position, 1.);

      // Transform into clip space
      q = modelViewProj * q;
      double w = q.w;
      q /= w;

      // Shift by (dx, dy).
      q.x += dx;
      q.y += dy;

      // Transform back into model space
      q *= w;
      q = modelViewProj.inv() * q;

      Matrix4x4 T = Matrix4x4::identity();
      for (Joint* j = this; j != nullptr; j = j->parent)
      {
          T = j->getRotation() * T;
      }
      T = skeleton->mesh->getRotation() * T;
      q = T.inv() * q;

      if (skeleton->root == this)
         position = q.to3D();
      else
         axis += q.to3D();
   }